

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

double pieceCountScore(game *Game)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar1 = (Game->boards).WK;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar2 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).WQ;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar3 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).WB;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar4 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).WP;
  uVar10 = (Game->boards).WN;
  uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
  uVar11 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
  uVar10 = (Game->boards).WR;
  uVar10 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
  uVar12 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar10 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BK;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar5 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BQ;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar6 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BB;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar7 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BN;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar8 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BR;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar9 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  uVar1 = (Game->boards).BP;
  uVar1 = uVar1 - (uVar1 >> 1 & 0x5555555555555555);
  uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
  return ((double)(byte)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) *
          -5.0 + (double)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * -3.0 +
                 (double)(byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * -3.0 +
                 (double)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * -9.0 +
                 (double)(byte)(((uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * -100.0 +
                 (double)(byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) +
                 (double)(byte)(((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * 5.0 +
                 (double)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * 3.0 +
                 (double)(byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * 3.0 +
                 (double)(byte)(((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * 9.0 +
                 (double)(byte)(((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38) * 100.0 + 0.0) -
         (double)(byte)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
}

Assistant:

double pieceCountScore(const game Game) {
  double score = 0.0;

  score += 100.0 * (double)boardCount(Game.boards.WK);
  score += 9.0 * (double)boardCount(Game.boards.WQ);
  score += 3.0 * (double)boardCount(Game.boards.WB);
  score += 3.0 * (double)boardCount(Game.boards.WN);
  score += 5.0 * (double)boardCount(Game.boards.WR);
  score += 1.0 * (double)boardCount(Game.boards.WP);

  score -= 100.0 * (double)boardCount(Game.boards.BK);
  score -= 9.0 * (double)boardCount(Game.boards.BQ);
  score -= 3.0 * (double)boardCount(Game.boards.BB);
  score -= 3.0 * (double)boardCount(Game.boards.BN);
  score -= 5.0 * (double)boardCount(Game.boards.BR);
  score -= 1.0 * (double)boardCount(Game.boards.BP);

  return score;
}